

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
roundTripString_testRoundTrip_Test::TestBody(roundTripString_testRoundTrip_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  uint64_t uVar3;
  precise_unit *un;
  Message *pMVar4;
  char *message;
  uint64_t in_RCX;
  precise_unit pVar5;
  AssertHelper local_c0;
  Message local_b8;
  string local_b0;
  precise_unit local_90;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  string str;
  string local_40;
  undefined1 local_20 [8];
  precise_unit u1;
  roundTripString_testRoundTrip_Test *this_local;
  
  u1._8_8_ = this;
  pPVar2 = testing::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam();
  std::__cxx11::string::string((string *)&local_40,(string *)pPVar2);
  uVar3 = units::getDefaultFlags();
  pVar5 = units::unit_from_string(&local_40,uVar3);
  u1.multiplier_ = pVar5._8_8_;
  local_20 = (undefined1  [8])pVar5.multiplier_;
  std::__cxx11::string::~string((string *)&local_40);
  un = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&gtest_ar.message_,(units *)local_20,un,in_RCX);
  std::__cxx11::string::string((string *)&local_b0,(string *)&gtest_ar.message_);
  uVar3 = units::getDefaultFlags();
  local_90 = units::unit_from_string(&local_b0,uVar3);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_80,"unit_from_string(str)","u1",&local_90,(precise_unit *)local_20);
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pMVar4 = testing::Message::operator<<
                       (&local_b8,(char (*) [32])"Round trip string didn\'t match ");
    pPVar2 = testing::
             WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::GetParam();
    pMVar4 = testing::Message::operator<<(pMVar4,pPVar2);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3dc,message);
    testing::internal::AssertHelper::operator=(&local_c0,pMVar4);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_P(roundTripString, testRoundTrip)
{
    auto u1 = unit_from_string(GetParam());
    auto str = to_string(u1);
    EXPECT_EQ(unit_from_string(str), u1)
        << "Round trip string didn't match " << GetParam();
}